

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_record.cc
# Opt level: O1

void __thiscall RecordField::RecordField(RecordField *this,FieldType tof,ID *id,Type *type)

{
  Field::Field(&this->super_Field,tof,7,id,type);
  (this->super_Field).super_DataDepElement._vptr_DataDepElement =
       (_func_int **)&PTR__RecordPaddingField_001456e0;
  this->record_type_ = (RecordType *)0x0;
  this->prev_ = (RecordField *)0x0;
  this->next_ = (RecordField *)0x0;
  this->begin_of_field_dataptr = (DataPtr *)0x0;
  this->end_of_field_dataptr = (DataPtr *)0x0;
  this->field_size_expr = (char *)0x0;
  this->field_offset_expr = (char *)0x0;
  this->end_of_field_dataptr_var = (ID *)0x0;
  this->static_offset_ = -1;
  this->parsing_state_seq_ = 0;
  this->boundary_checked_ = false;
  return;
}

Assistant:

RecordField::RecordField(FieldType tof, ID* id, Type* type)
	: Field(tof, TYPE_TO_BE_PARSED | CLASS_MEMBER | PUBLIC_READABLE, id, type)
	{
	begin_of_field_dataptr = nullptr;
	end_of_field_dataptr = nullptr;
	field_size_expr = nullptr;
	field_offset_expr = nullptr;
	end_of_field_dataptr_var = nullptr;
	record_type_ = nullptr;
	prev_ = nullptr;
	next_ = nullptr;
	static_offset_ = -1;
	parsing_state_seq_ = 0;
	boundary_checked_ = false;
	}